

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O0

void rf5c68_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint local_54;
  int sample;
  int rv;
  int lv;
  pcm_channel *chan;
  UINT32 j;
  UINT8 i;
  DEV_SMPL *right;
  DEV_SMPL *left;
  rf5c68_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *info_local;
  
  __s = *outputs;
  __s_00 = outputs[1];
  memset(__s,0,(ulong)samples << 2);
  memset(__s_00,0,(ulong)samples << 2);
  if ((*(long *)((long)info + 0x90) != 0) && (*(char *)((long)info + 0x8a) != '\0')) {
    for (chan._7_1_ = 0; chan._7_1_ < 8; chan._7_1_ = chan._7_1_ + 1) {
      pcVar3 = (char *)((long)info + (ulong)chan._7_1_ * 0x10 + 8);
      if ((*pcVar3 != '\0') && (pcVar3[0xc] == '\0')) {
        iVar1 = ((byte)pcVar3[2] & 0xf) * (uint)(byte)pcVar3[1];
        iVar2 = ((int)(uint)(byte)pcVar3[2] >> 4) * (uint)(byte)pcVar3[1];
        for (chan._0_4_ = 0; (uint)chan < samples; chan._0_4_ = (uint)chan + 1) {
          if ((*(long *)((long)info + 0x98) != 0) &&
             ((*(uint *)(pcVar3 + 4) >> 0xb & 0xfff) == 0xfff)) {
            (**(code **)((long)info + 0x98))
                      (*(undefined8 *)((long)info + 0xa0),*(uint *)(pcVar3 + 4) >> 0x18);
          }
          local_54 = (uint)*(byte *)(*(long *)((long)info + 0x90) +
                                    (ulong)(*(uint *)(pcVar3 + 4) >> 0xb & 0xffff));
          if (local_54 == 0xff) {
            *(uint *)(pcVar3 + 4) = (uint)*(ushort *)(pcVar3 + 10) << 0xb;
            local_54 = (uint)*(byte *)(*(long *)((long)info + 0x90) +
                                      (ulong)(*(uint *)(pcVar3 + 4) >> 0xb & 0xffff));
            if (local_54 == 0xff) break;
          }
          *(uint *)(pcVar3 + 4) = (uint)*(ushort *)(pcVar3 + 8) + *(int *)(pcVar3 + 4);
          if ((local_54 & 0x80) == 0) {
            __s[(uint)chan] = __s[(uint)chan] - ((int)(local_54 * iVar1) >> 5);
            __s_00[(uint)chan] = __s_00[(uint)chan] - ((int)(local_54 * iVar2) >> 5);
          }
          else {
            __s[(uint)chan] = ((int)((local_54 & 0x7f) * iVar1) >> 5) + __s[(uint)chan];
            __s_00[(uint)chan] = ((int)((local_54 & 0x7f) * iVar2) >> 5) + __s_00[(uint)chan];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void rf5c68_update(void *info, UINT32 samples, DEV_SMPL **outputs)
{
	rf5c68_state *chip = (rf5c68_state *)info;
	DEV_SMPL *left = outputs[0];
	DEV_SMPL *right = outputs[1];
	UINT8 i;
	UINT32 j;

	/* start with clean buffers */
	memset(left, 0, samples * sizeof(*left));
	memset(right, 0, samples * sizeof(*right));

	/* bail if not enabled */
	if (chip->data == NULL || !chip->enable)
		return;

	/* loop over channels */
	for (i = 0; i < NUM_CHANNELS; i++)
	{
		pcm_channel *chan = &chip->chan[i];

		/* if this channel is active, accumulate samples */
		if (chan->enable && ! chan->Muted)
		{
			int lv = (chan->pan & 0x0f) * chan->env;
			int rv = ((chan->pan >> 4) & 0x0f) * chan->env;

			/* loop over the sample buffer */
			for (j = 0; j < samples; j++)
			{
				int sample;

				/* trigger sample callback */
				if(chip->sample_end_cb)
				{
					if(((chan->addr >> 11) & 0xfff) == 0xfff)
						chip->sample_end_cb(chip->sample_cb_param,(chan->addr >> 11)/0x2000);
				}

				/* fetch the sample and handle looping */
				sample = chip->data[(chan->addr >> 11) & 0xffff];
				if (sample == 0xff)
				{
					chan->addr = chan->loopst << 11;
					sample = chip->data[(chan->addr >> 11) & 0xffff];

					/* if we loop to a loop point, we're effectively dead */
					if (sample == 0xff)
						break;
				}
				chan->addr += chan->step;

				/* add to the buffer */
				if (sample & 0x80)
				{
					sample &= 0x7f;
					left[j] += (sample * lv) >> 5;
					right[j] += (sample * rv) >> 5;
				}
				else
				{
					left[j] -= (sample * lv) >> 5;
					right[j] -= (sample * rv) >> 5;
				}
			}
		}
	}
	
#if 0	// IMO this is completely useless.
	/* now clamp and shift the result (output is only 10 bits) */
	for (j = 0; j < samples; j++)
	{
		DEV_SMPL temp;

		temp = left[j];
		if (temp > 32767) temp = 32767;
		else if (temp < -32768) temp = -32768;
		left[j] = temp & ~0x3f;

		temp = right[j];
		if (temp > 32767) temp = 32767;
		else if (temp < -32768) temp = -32768;
		right[j] = temp & ~0x3f;
	}
#endif
}